

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solstack.c
# Opt level: O1

void stk_InitFull(SolStack_t *stackPtr)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  time_t tVar5;
  ECardType_t ct;
  ECardType_t EVar6;
  ulong uVar7;
  Card_t *card1Ptr;
  ECardColor_t cc;
  ECardColor_t EVar8;
  long lVar9;
  long lVar10;
  
  if (stackPtr != (SolStack_t *)0x0) {
    EVar8 = CC_SPADES;
    memset(stackPtr,0,0x278);
    uVar4 = 0;
    do {
      EVar6 = CT_ACE;
      uVar7 = uVar4;
      do {
        if (uVar7 < 0x34) {
          uVar4 = uVar7 + 1;
          stackPtr->m_size = uVar4;
          stackPtr->m_cards[uVar7].m_color = EVar8;
          stackPtr->m_cards[uVar7].m_type = EVar6;
          stackPtr->m_cards[uVar7].m_face = CF_DOWN;
          uVar7 = uVar4;
        }
        EVar6 = EVar6 + CT_ACE;
      } while (EVar6 != NUM_CARD_TYPES);
      EVar8 = EVar8 + CC_HEARTS;
    } while (EVar8 != NUM_CARD_COLORS);
    tVar5 = time((time_t *)0x0);
    srand((uint)tVar5);
    uVar2 = (int)stackPtr->m_size - 1;
    if (-1 < (int)uVar2) {
      card1Ptr = stackPtr->m_cards + uVar2;
      lVar9 = (ulong)uVar2 + 1;
      do {
        iVar3 = rand();
        card_Swap(card1Ptr,stackPtr->m_cards + iVar3 % (int)lVar9);
        card1Ptr = card1Ptr + -1;
        lVar10 = lVar9 + -1;
        bVar1 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar1);
    }
  }
  return;
}

Assistant:

void stk_InitFull(SolStack_t* stackPtr)
{
  if (stackPtr) {
    stk_InitEmpty(stackPtr);
    // fill the stack with all combinations of color and type
    for (ECardColor_t cc = CC_SPADES; cc <= CC_DIAMONDS; cc++) {
      for (ECardType_t ct = CT_ACE; ct <= CT_KING; ct++) {
        PushNew(stackPtr, cc, ct);
      }
    }

    Shuffle(stackPtr);
  }
}